

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSMC.h
# Opt level: O3

void __thiscall
chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>::
CalculateQ(ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
           *this,ChState *stateA_x,ChStateDelta *stateA_w,ChState *stateB_x,ChStateDelta *stateB_w,
          ChMaterialCompositeSMC *mat,ChVectorDynamic<> *Q)

{
  ChContactable_3vars<6,_6,_6> *pCVar1;
  ChContactable_3vars<3,_3,_3> *pCVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  ChVector<double> p2_abs;
  ChVector<double> p2_loc;
  ChVector<double> p1_loc;
  ChVector<double> p1_abs;
  ChVector<double> force;
  ChVector<double> vel2;
  ChVector<double> vel1;
  ChVector<double> normal_dir;
  double local_138;
  double local_130;
  double local_128;
  undefined1 local_120 [24];
  undefined1 local_108 [24];
  ChCoordsys<double> local_f0;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  ChVector<double> local_98;
  ChVector<double> local_78;
  ChVector<double> local_60;
  ChVector<double> local_48;
  
  (*(((this->
      super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
      ).objA)->super_ChContactable)._vptr_ChContactable[0xb])(&local_f0);
  ChCoordsys<double>::TransformPointParentToLocal
            (&local_f0,
             &(this->
              super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
              ).p1);
  (*(((this->
      super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
      ).objB)->super_ChContactable)._vptr_ChContactable[0xb])(&local_f0);
  ChCoordsys<double>::TransformPointParentToLocal
            (&local_f0,
             &(this->
              super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
              ).p2);
  pCVar1 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
           ).objA;
  (*(pCVar1->super_ChContactable)._vptr_ChContactable[8])(&local_f0,pCVar1,local_108,stateA_x);
  pCVar2 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
           ).objB;
  (*(pCVar2->super_ChContactable)._vptr_ChContactable[8])(&local_138,pCVar2,local_120,stateB_x);
  local_f0.pos.m_data[1] = local_f0.pos.m_data[1] - local_130;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_f0.pos.m_data[0] - local_138;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_f0.pos.m_data[1] * local_f0.pos.m_data[1];
  auVar5 = vfmadd231sd_fma(auVar15,auVar11,auVar11);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_f0.pos.m_data[2] - local_128;
  auVar5 = vfmadd231sd_fma(auVar5,auVar14,auVar14);
  auVar11 = vsqrtsd_avx(auVar5,auVar5);
  dVar17 = auVar11._0_8_;
  bVar4 = 2.2250738585072014e-308 <= dVar17;
  dVar16 = 1.0 / dVar17;
  auVar8._0_8_ = (double)((ulong)bVar4 * (long)((local_f0.pos.m_data[0] - local_138) * dVar16) +
                         (ulong)!bVar4 * 0x3ff0000000000000);
  auVar8._8_8_ = 0;
  local_48.m_data[1] = (double)((ulong)bVar4 * (long)(local_f0.pos.m_data[1] * dVar16));
  local_48.m_data[2] =
       (double)((ulong)bVar4 * (long)((local_f0.pos.m_data[2] - local_128) * dVar16));
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_48.m_data[2];
  pCVar1 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
           ).objA;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (this->
                 super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
                 ).normal.m_data[0];
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       local_48.m_data[1] *
       (this->
       super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
       ).normal.m_data[1];
  auVar5 = vfmadd231sd_fma(auVar12,auVar8,auVar5);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (this->
       super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
       ).normal.m_data[2];
  auVar5 = vfmadd231sd_fma(auVar5,auVar9,auVar10);
  auVar6._8_8_ = 0x8000000000000000;
  auVar6._0_8_ = 0x8000000000000000;
  auVar10 = vxorpd_avx512vl(auVar11,auVar6);
  uVar3 = vcmpsd_avx512f(auVar5,ZEXT816(0),1);
  bVar4 = (bool)((byte)uVar3 & 1);
  local_48.m_data[0] = auVar8._0_8_;
  (*(pCVar1->super_ChContactable)._vptr_ChContactable[9])
            (&local_60,pCVar1,local_108,stateA_x,stateA_w);
  pCVar2 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
           ).objB;
  (*(pCVar2->super_ChContactable)._vptr_ChContactable[9])
            (&local_78,pCVar2,local_120,stateB_x,stateB_w);
  CalculateForce(&local_98,this,
                 (double)((ulong)bVar4 * auVar10._0_8_ + (ulong)!bVar4 * (long)dVar17),&local_48,
                 &local_60,&local_78,mat);
  pCVar1 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
           ).objA;
  auVar13._0_8_ = -local_98.m_data[2];
  auVar13._8_4_ = 0;
  auVar13._12_4_ = 0x80000000;
  local_b8._0_8_ = local_98.m_data[0] ^ 0x8000000000000000;
  local_b8._8_4_ = local_98.m_data[1]._0_4_;
  local_b8._12_4_ = local_98.m_data[1]._4_4_ ^ 0x80000000;
  local_a8 = vmovlps_avx(auVar13);
  (*(pCVar1->super_ChContactable)._vptr_ChContactable[0xd])(pCVar1,local_b8,&local_f0,stateA_x,Q,0);
  pCVar2 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
           ).objB;
  uVar7 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
              ).objA)->super_ChContactable)._vptr_ChContactable[4])();
  (*(pCVar2->super_ChContactable)._vptr_ChContactable[0xd])
            (pCVar2,&local_98,&local_138,stateB_x,Q,(ulong)uVar7);
  return;
}

Assistant:

void CalculateQ(const ChState& stateA_x,            ///< state positions for objA
                    const ChStateDelta& stateA_w,       ///< state velocities for objA
                    const ChState& stateB_x,            ///< state positions for objB
                    const ChStateDelta& stateB_w,       ///< state velocities for objB
                    const ChMaterialCompositeSMC& mat,  ///< composite material for contact pair
                    ChVectorDynamic<>& Q                ///< output generalized forces
    ) {
        // Express contact points in local frames.
        // We assume that these points remain fixed to their respective contactable objects.
        ChVector<> p1_loc = this->objA->GetCsysForCollisionModel().TransformPointParentToLocal(this->p1);
        ChVector<> p2_loc = this->objB->GetCsysForCollisionModel().TransformPointParentToLocal(this->p2);

        // Express the local points in global frame
        ChVector<> p1_abs = this->objA->GetContactPoint(p1_loc, stateA_x);
        ChVector<> p2_abs = this->objB->GetContactPoint(p2_loc, stateB_x);

        /*
            Note: while this can be somewhat justified for a ChBody, it will not work
                  for a mesh vertex for instance...

        // Project the points onto the unperturbed normal line
        p1_abs = this->p1 + Vdot(p1_abs - this->p1, this->normal) * this->normal;
        p2_abs = this->p2 + Vdot(p2_abs - this->p2, this->normal) * this->normal;
        */

        // Calculate normal direction (expressed in global frame)
        ChVector<> normal_dir = (p1_abs - p2_abs).GetNormalized();

        // Calculate penetration depth
        double delta = (p1_abs - p2_abs).Length();

        // If the normal direction flipped sign, change sign of delta
        if (Vdot(normal_dir, this->normal) < 0)
            delta = -delta;

        // Calculate velocity of contact points (expressed in global frame)
        ChVector<> vel1 = this->objA->GetContactPointSpeed(p1_loc, stateA_x, stateA_w);
        ChVector<> vel2 = this->objB->GetContactPointSpeed(p2_loc, stateB_x, stateB_w);

        // Compute the contact force.
        ChVector<> force = CalculateForce(delta, normal_dir, vel1, vel2, mat);

        // Compute and load the generalized contact forces.
        this->objA->ContactForceLoadQ(-force, p1_abs, stateA_x, Q, 0);
        this->objB->ContactForceLoadQ(force, p2_abs, stateB_x, Q, this->objA->ContactableGet_ndof_w());
    }